

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelControl.cpp
# Opt level: O2

void trackerboy::ChannelControl<(trackerboy::ChType)3>::clear(IApuIo *apu)

{
  int iVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  
  cVar2 = '\x05';
  cVar3 = '\0';
  while (bVar4 = cVar2 != '\0', cVar2 = cVar2 + -1, bVar4) {
    (*apu->_vptr_IApuIo[1])(apu,(ulong)(byte)(cVar3 + 0x1f),0);
    cVar3 = cVar3 + '\x01';
  }
  iVar1 = (**apu->_vptr_IApuIo)(apu,0x25);
  (*apu->_vptr_IApuIo[1])(apu,0x25,(ulong)((byte)iVar1 & 0x77));
  return;
}

Assistant:

void ChannelControl<ch>::clear(IApuIo &apu) noexcept {
    // clear registers
    constexpr uint8_t regno = IApuIo::REG_NR10 + (+ch * GB_CHANNEL_REGS);
    for (uint8_t i = 0; i != GB_CHANNEL_REGS; ++i) {
        apu.writeRegister(regno + i, 0);
    }
    // clear terminals for the channel
    auto nr51 = apu.readRegister(IApuIo::REG_NR51);
    nr51 &= ~((uint8_t)0x11 << (+ch));
    apu.writeRegister(IApuIo::REG_NR51, nr51);
}